

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_tile_init(TileInfo *tile,AV1_COMMON *cm,int row,int col)

{
  int in_ECX;
  int in_EDX;
  AV1_COMMON *in_RSI;
  TileInfo *in_RDI;
  
  av1_tile_set_row(in_RDI,in_RSI,in_EDX);
  av1_tile_set_col(in_RDI,in_RSI,in_ECX);
  return;
}

Assistant:

void av1_tile_init(TileInfo *tile, const AV1_COMMON *cm, int row, int col) {
  av1_tile_set_row(tile, cm, row);
  av1_tile_set_col(tile, cm, col);
}